

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Int_t * Pdr_InvMap(Vec_Int_t *vCounts)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vMap;
  undefined4 local_18;
  int Count;
  int k;
  int i;
  Vec_Int_t *vCounts_local;
  
  local_18 = 0;
  iVar1 = Vec_IntSize(vCounts);
  p = Vec_IntStart(iVar1);
  for (Count = 0; iVar1 = Vec_IntSize(vCounts), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_IntEntry(vCounts,Count);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p,Count,local_18);
      local_18 = local_18 + 1;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Pdr_InvMap( Vec_Int_t * vCounts )
{
    int i, k = 0, Count;
    Vec_Int_t * vMap = Vec_IntStart( Vec_IntSize(vCounts) );
    Vec_IntForEachEntry( vCounts, Count, i )
        if ( Count )
            Vec_IntWriteEntry( vMap, i, k++ );
    return vMap;
}